

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

Machine * unify(Machine *__return_storage_ptr__,Machine *m,Addr a1,Addr a2)

{
  Hix HVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  Machine *pMVar5;
  Addr a1_00;
  Addr a2_00;
  Addr a;
  Machine local_430;
  Machine local_3c0;
  Machine local_350;
  Machine local_2e0;
  Machine local_270;
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  local_200;
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  local_1d0;
  undefined8 local_1a0;
  Mode local_198;
  undefined1 local_190 [8];
  Hcell h1;
  Functor f2;
  Hcell h2;
  _Rb_tree_node_base local_100;
  size_t local_e0;
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  local_d8;
  undefined8 local_a8;
  Mode local_a0;
  undefined1 local_98 [8];
  Functor f1;
  Addr local_68;
  _Base_ptr local_58;
  Machine *local_50;
  Addr local_48;
  map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  *local_38;
  
  local_58 = (_Base_ptr)CONCAT44(local_58._4_4_,a2.hix_.hix.hix);
  local_50 = __return_storage_ptr__;
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)&local_3c0,
             (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)m);
  local_38 = &m->regval;
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::_Rb_tree(&local_3c0.regval._M_t,&local_38->_M_t);
  local_3c0.mode = m->mode;
  local_3c0.h.hix = (m->h).hix;
  local_3c0.s.hix = (m->s).hix;
  local_48 = deref(&local_3c0,a1);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::~_Rb_tree(&local_3c0.regval._M_t);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
               *)&local_3c0);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)&local_350,
             (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)m);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::_Rb_tree(&local_350.regval._M_t,&local_38->_M_t);
  local_350.mode = m->mode;
  local_350.h.hix = (m->h).hix;
  local_350.s.hix = (m->s).hix;
  a.hix_.hix = local_58._0_4_;
  a.tag_ = (int)a2._0_8_;
  a.r_.r = (int)((ulong)a2._0_8_ >> 0x20);
  local_68 = deref(&local_350,a);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::~_Rb_tree(&local_350.regval._M_t);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
               *)&local_350);
  bVar2 = Addr::operator==(&local_48,&local_68);
  pMVar5 = local_50;
  if (bVar2) {
    std::_Rb_tree_header::_Rb_tree_header
              (&(local_50->heap)._M_t._M_impl.super__Rb_tree_header,
               &(m->heap)._M_t._M_impl.super__Rb_tree_header);
    std::_Rb_tree_header::_Rb_tree_header
              (&(pMVar5->regval)._M_t._M_impl.super__Rb_tree_header,
               &(m->regval)._M_t._M_impl.super__Rb_tree_header);
    pMVar5->mode = m->mode;
    HVar1.hix = (m->s).hix;
    pMVar5->h = (Hix)(m->h).hix;
    pMVar5->s = (Hix)HVar1.hix;
  }
  else {
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)&local_2e0,
               (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)m);
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::_Rb_tree(&local_2e0.regval._M_t,&local_38->_M_t);
    local_2e0.mode = m->mode;
    local_2e0.h.hix = (m->h).hix;
    local_2e0.s.hix = (m->s).hix;
    machineAtAddr((Hcell *)local_190,&local_2e0,local_48);
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::~_Rb_tree(&local_2e0.regval._M_t);
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                 *)&local_2e0);
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)&local_270,
               (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)m);
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::_Rb_tree(&local_270.regval._M_t,&local_38->_M_t);
    local_270.mode = m->mode;
    local_270.h.hix = (m->h).hix;
    local_270.s.hix = (m->s).hix;
    machineAtAddr((Hcell *)&f2.arity,&local_270,local_68);
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::~_Rb_tree(&local_270.regval._M_t);
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                 *)&local_270);
    if ((local_190._0_4_ == Ref) || (f2.arity == 0)) {
      std::
      _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
      ::_Rb_tree(&local_200,
                 (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                  *)m);
      std::
      _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
      ::_Rb_tree(&local_1d0,&local_38->_M_t);
      pMVar5 = local_50;
      local_198 = m->mode;
      local_1a0._0_4_ = m->h;
      local_1a0._4_4_ = m->s;
      bind((int)local_50,(sockaddr *)&local_200,local_48.tag_);
      std::
      _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
      ::~_Rb_tree(&local_1d0);
      std::
      _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
      ::~_Rb_tree(&local_200);
    }
    else {
      if (Str < (uint)local_190._0_4_) {
LAB_00103da9:
        __assert_fail("tag == Htag::Ref || tag == Htag::Str",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                      ,0x7b,"Hix Hcell::hix() const");
      }
      h2.f_.arity = local_190._4_4_;
      pmVar4 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
               operator[](&m->heap,(key_type *)&h2.f_.arity);
      Hcell::f((Functor *)local_98,pmVar4);
      if (1 < (uint)f2.arity) goto LAB_00103da9;
      h2.f_.arity = f2._36_4_;
      pmVar4 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
               operator[](&m->heap,(key_type *)&h2.f_.arity);
      Hcell::f((Functor *)&h1.f_.arity,pmVar4);
      if (f1.id._M_dataplus._M_p == f2.id._M_dataplus._M_p) {
        if (f1.id._M_dataplus._M_p == (pointer)0x0) {
          bVar2 = true;
        }
        else {
          iVar3 = bcmp((void *)local_98,(void *)h1.f_._32_8_,(size_t)f1.id._M_dataplus._M_p);
          bVar2 = iVar3 == 0;
        }
      }
      else {
        bVar2 = false;
      }
      if ((!bVar2) || (f1.id.field_2._8_4_ != f2.id.field_2._8_4_)) {
        __assert_fail("f1 == f2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                      ,0x157,"Machine unify(Machine, Addr, Addr)");
      }
      if (0 < (int)f1.id.field_2._8_4_) {
        local_58 = &(m->heap)._M_t._M_impl.super__Rb_tree_header._M_header;
        f1._32_8_ = &(m->regval)._M_t._M_impl.super__Rb_tree_header;
        iVar3 = 1;
        do {
          std::
          _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
          ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                      *)&local_430,
                     (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                      *)m);
          std::
          _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
          ::_Rb_tree(&local_430.regval._M_t,&local_38->_M_t);
          local_430.mode = m->mode;
          local_430.h.hix = (m->h).hix;
          local_430.s.hix = (m->s).hix;
          if ((Str < (uint)local_190._0_4_) || (1 < (uint)f2.arity)) goto LAB_00103da9;
          a1_00.hix_.hix = local_190._4_4_ + iVar3;
          a2_00.hix_.hix = f2._36_4_ + iVar3;
          a1_00.tag_ = Heap;
          a1_00.r_.r = -0x2a;
          a2_00.tag_ = Heap;
          a2_00.r_.r = -0x2a;
          unify((Machine *)&h2.f_.arity,&local_430,a1_00,a2_00);
          std::
          _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
          ::clear((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                   *)m);
          if (local_100._M_parent != (_Base_ptr)0x0) {
            (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_100._M_color;
            (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_100._M_parent;
            (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_100._M_left;
            (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_100._M_right;
            (local_100._M_parent)->_M_parent = local_58;
            (m->heap)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_e0;
            local_100._M_parent = (_Base_ptr)0x0;
            local_100._M_left = &local_100;
            local_e0 = 0;
            local_100._M_right = local_100._M_left;
          }
          std::
          _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
          ::clear(&local_38->_M_t);
          if (local_d8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            (m->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 local_d8._M_impl.super__Rb_tree_header._M_header._M_color;
            (m->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 local_d8._M_impl.super__Rb_tree_header._M_header._M_parent;
            (m->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
            (m->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_d8._M_impl.super__Rb_tree_header._M_header._M_right;
            (local_d8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                 (_Base_ptr)f1._32_8_;
            (m->regval)._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 local_d8._M_impl.super__Rb_tree_header._M_node_count;
            local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_d8._M_impl.super__Rb_tree_header._M_header;
            local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          m->mode = local_a0;
          m->h = (Hix)(undefined4)local_a8;
          m->s = (Hix)local_a8._4_4_;
          std::
          _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
          ::~_Rb_tree(&local_d8);
          std::
          _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
          ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                       *)&h2.f_.arity);
          std::
          _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
          ::~_Rb_tree(&local_430.regval._M_t);
          std::
          _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
          ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                       *)&local_430);
          bVar2 = iVar3 < (int)f1.id.field_2._8_4_;
          iVar3 = iVar3 + 1;
        } while (bVar2);
      }
      if ((size_type *)h1.f_._32_8_ != &f2.id._M_string_length) {
        operator_delete((void *)h1.f_._32_8_,f2.id._M_string_length + 1);
      }
      if (local_98 != (undefined1  [8])&f1.id._M_string_length) {
        operator_delete((void *)local_98,f1.id._M_string_length + 1);
      }
      pMVar5 = local_50;
      std::_Rb_tree_header::_Rb_tree_header
                (&(local_50->heap)._M_t._M_impl.super__Rb_tree_header,
                 &(m->heap)._M_t._M_impl.super__Rb_tree_header);
      std::_Rb_tree_header::_Rb_tree_header
                (&(pMVar5->regval)._M_t._M_impl.super__Rb_tree_header,
                 &(m->regval)._M_t._M_impl.super__Rb_tree_header);
      pMVar5->mode = m->mode;
      HVar1.hix = (m->s).hix;
      pMVar5->h = (Hix)(m->h).hix;
      pMVar5->s = (Hix)HVar1.hix;
    }
    if ((size_type *)h2._0_8_ != &h2.f_.id._M_string_length) {
      operator_delete((void *)h2._0_8_,h2.f_.id._M_string_length + 1);
    }
    if ((size_type *)h1._0_8_ != &h1.f_.id._M_string_length) {
      operator_delete((void *)h1._0_8_,h1.f_.id._M_string_length + 1);
    }
  }
  return pMVar5;
}

Assistant:

Machine unify(Machine m, Addr a1, Addr a2) {
    Addr d1 = deref(m, a1), d2 = deref(m, a2);
    if (d1 == d2) return m;

    Hcell h1 = machineAtAddr(m, d1), h2 = machineAtAddr(m, d2);

    if (h1.tag == Htag::Ref || h2.tag == Htag::Ref) {
        return bind(m, d1, d2);
    } else {
        Functor f1 = m.heap[h1.hix()], f2 = m.heap[h2.hix()];
        assert(f1 == f2);

        for (int i = 1; i <= f1.arity; i++) {
            // We now union the subterms of the functor
            m = unify(m, h1.hix() + i, h2.hix() + i);
        }
    }

    return m;
}